

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

optional<pbrt::CameraRayDifferential> * __thiscall
pbrt::PerspectiveCamera::GenerateRayDifferential
          (optional<pbrt::CameraRayDifferential> *__return_storage_ptr__,PerspectiveCamera *this,
          CameraSample *sample,SampledWavelengths *lambda)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Tuple2<pbrt::Point2,_float> TVar5;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar6;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  RayDifferential local_108;
  undefined1 local_a8 [16];
  anon_struct_8_0_00000001_for___align local_90;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  undefined8 uStack_7c;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float fStack_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  undefined8 uStack_44;
  undefined8 uStack_3c;
  
  fVar16 = (sample->pFilm).super_Tuple2<pbrt::Point2,_float>.x;
  fVar15 = (sample->pFilm).super_Tuple2<pbrt::Point2,_float>.y;
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * (this->super_ProjectiveCamera).cameraFromRaster.
                                                    m.m[0][1])),ZEXT416((uint)fVar16),
                            ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[0][0])
                           );
  auVar20 = ZEXT816(0) << 0x40;
  auVar27 = vfmadd231ss_fma(auVar27,auVar20,
                            ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[0][2])
                           );
  fVar17 = auVar27._0_4_ + (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][3];
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * (this->super_ProjectiveCamera).cameraFromRaster.
                                                    m.m[1][1])),ZEXT416((uint)fVar16),
                            ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][0])
                           );
  auVar27 = vfmadd231ss_fma(auVar27,auVar20,
                            ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][2])
                           );
  fVar21 = auVar27._0_4_ + (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][3];
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * (this->super_ProjectiveCamera).cameraFromRaster.
                                                    m.m[2][1])),ZEXT416((uint)fVar16),
                            ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[2][0])
                           );
  auVar27 = vfmadd231ss_fma(auVar27,auVar20,
                            ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[2][2])
                           );
  fVar22 = auVar27._0_4_ + (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][3];
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * (this->super_ProjectiveCamera).cameraFromRaster.
                                                    m.m[3][1])),ZEXT416((uint)fVar16),
                            ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[3][0])
                           );
  auVar27 = vfmadd231ss_fma(auVar27,auVar20,
                            ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[3][2])
                           );
  fVar16 = auVar27._0_4_ + (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][3];
  bVar11 = fVar16 == 1.0;
  auVar20 = ZEXT416((uint)bVar11 * (int)fVar17 + (uint)!bVar11 * (int)(fVar17 / fVar16));
  fVar15 = (float)((uint)bVar11 * (int)fVar21 + (uint)!bVar11 * (int)(fVar21 / fVar16));
  fVar16 = (float)((uint)bVar11 * (int)fVar22 + (uint)!bVar11 * (int)(fVar22 / fVar16));
  auVar27 = vinsertps_avx(auVar20,ZEXT416((uint)fVar15),0x10);
  auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar15)),auVar20,auVar20);
  auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar16),ZEXT416((uint)fVar16));
  if (auVar20._0_4_ < 0.0) {
    local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z = sqrtf(auVar20._0_4_);
  }
  else {
    auVar20 = vsqrtss_avx(auVar20,auVar20);
    local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar20._0_4_;
  }
  auVar20._4_4_ = local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20._0_4_ = local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20._8_4_ = local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20._12_4_ = local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20 = vdivps_avx(auVar27,auVar20);
  local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
       fVar16 / local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(sample->time *
                                          (this->super_ProjectiveCamera).super_CameraBase.
                                          shutterClose)),ZEXT416((uint)(1.0 - sample->time)),
                            ZEXT416((uint)(this->super_ProjectiveCamera).super_CameraBase.
                                          shutterOpen));
  local_108.super_Ray.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(this->super_ProjectiveCamera).super_CameraBase.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar20);
  local_108.super_Ray.time = auVar18._0_4_;
  local_108.hasDifferentials = false;
  local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  fVar15 = (this->super_ProjectiveCamera).lensRadius;
  if (0.0 < fVar15) {
    TVar5 = (sample->pLens).super_Tuple2<pbrt::Point2,_float>;
    fVar17 = TVar5.x;
    fVar21 = TVar5.y;
    auVar19._0_4_ = fVar17 + fVar17;
    auVar19._4_4_ = fVar21 + fVar21;
    auVar19._8_8_ = 0;
    auVar18._8_4_ = 0xbf800000;
    auVar18._0_8_ = 0xbf800000bf800000;
    auVar18._12_4_ = 0xbf800000;
    auVar18 = vaddps_avx512vl(auVar19,auVar18);
    auVar20 = vmovshdup_avx(auVar18);
    fVar21 = auVar18._0_4_;
    fVar17 = auVar20._0_4_;
    if ((fVar21 != 0.0) || (NAN(fVar21))) {
LAB_003e0ed5:
      auVar12._8_4_ = 0x7fffffff;
      auVar12._0_8_ = 0x7fffffff7fffffff;
      auVar12._12_4_ = 0x7fffffff;
      auVar19 = vandps_avx512vl(auVar18,auVar12);
      auVar20 = vshufps_avx(auVar19,auVar19,0xf5);
      bVar11 = auVar20._0_4_ < auVar19._0_4_;
      auVar40._0_4_ = fVar21 / fVar17;
      auVar40._4_12_ = auVar18._4_12_;
      auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar40,ZEXT416(0x3fc90fdb));
      local_a8._4_12_ = auVar20._4_12_;
      local_a8._0_4_ =
           (uint)bVar11 * (int)((fVar17 / fVar21) * 0.7853982) + (uint)!bVar11 * auVar20._0_4_;
      fVar17 = (float)((uint)bVar11 * (int)fVar21 + (uint)!bVar11 * (int)fVar17);
      fVar21 = cosf((float)local_a8._0_4_);
      fVar22 = sinf((float)local_a8._0_4_);
      auVar20 = vinsertps_avx(ZEXT416((uint)(fVar17 * fVar21)),ZEXT416((uint)(fVar17 * fVar22)),0x10
                             );
    }
    else {
      auVar20 = ZEXT816(0) << 0x20;
      if ((fVar17 != 0.0) || (NAN(fVar17))) goto LAB_003e0ed5;
    }
    fVar21 = (this->super_ProjectiveCamera).focalDistance /
             local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
    fVar17 = local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z * fVar21 +
             local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z;
    auVar31._0_4_ = fVar15 * auVar20._0_4_;
    auVar31._4_4_ = fVar15 * auVar20._4_4_;
    auVar31._8_4_ = fVar15 * auVar20._8_4_;
    auVar31._12_4_ = fVar15 * auVar20._12_4_;
    local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
    auVar23._0_4_ =
         local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x * fVar21 +
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
    auVar23._4_4_ =
         local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y * fVar21 +
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
    auVar23._8_4_ = fVar21 * 0.0 + 0.0;
    auVar23._12_4_ = fVar21 * 0.0 + 0.0;
    local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar31);
    auVar18 = vsubps_avx(auVar23,auVar31);
    auVar24._0_4_ = auVar18._0_4_ * auVar18._0_4_;
    auVar24._4_4_ = auVar18._4_4_ * auVar18._4_4_;
    auVar24._8_4_ = auVar18._8_4_ * auVar18._8_4_;
    auVar24._12_4_ = auVar18._12_4_ * auVar18._12_4_;
    auVar20 = vmovshdup_avx(auVar24);
    auVar20 = vfmadd231ss_fma(auVar20,auVar18,auVar18);
    auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar17),ZEXT416((uint)fVar17));
    if (auVar20._0_4_ < 0.0) {
      local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z = sqrtf(auVar20._0_4_);
    }
    else {
      auVar20 = vsqrtss_avx(auVar20,auVar20);
      local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar20._0_4_;
    }
    auVar32._4_4_ = local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar32._0_4_ = local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar32._8_4_ = local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar32._12_4_ = local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar20 = vdivps_avx(auVar18,auVar32);
    local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
         fVar17 / local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
    local_108.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar20);
  }
  fVar15 = (this->super_ProjectiveCamera).lensRadius;
  local_138 = auVar27._0_4_;
  fStack_134 = auVar27._4_4_;
  fStack_130 = auVar27._8_4_;
  fStack_12c = auVar27._12_4_;
  if (fVar15 <= 0.0) {
    local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z =
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z;
    local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x =
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
    local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y =
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
    local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z =
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z;
    local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x =
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
    local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y =
         local_108.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
    fVar15 = fVar16 + (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z;
    uVar2 = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar8 = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar44._0_4_ = (float)uVar2 + local_138;
    auVar44._4_4_ = (float)uVar8 + fStack_134;
    auVar44._8_4_ = fStack_130 + 0.0;
    auVar44._12_4_ = fStack_12c + 0.0;
    auVar27._0_4_ = auVar44._0_4_ * auVar44._0_4_;
    auVar27._4_4_ = auVar44._4_4_ * auVar44._4_4_;
    auVar27._8_4_ = auVar44._8_4_ * auVar44._8_4_;
    auVar27._12_4_ = auVar44._12_4_ * auVar44._12_4_;
    auVar27 = vmovshdup_avx(auVar27);
    auVar27 = vfmadd231ss_fma(auVar27,auVar44,auVar44);
    auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
    if (auVar27._0_4_ < 0.0) {
      local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = sqrtf(auVar27._0_4_);
    }
    else {
      auVar27 = vsqrtss_avx(auVar27,auVar27);
      local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = auVar27._0_4_;
    }
    auVar35._4_4_ = local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar35._0_4_ = local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar35._8_4_ = local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar35._12_4_ = local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar27 = vdivps_avx(auVar44,auVar35);
    local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z =
         fVar15 / local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
    local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar27);
    uVar3 = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar9 = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar45._0_4_ = (float)uVar3 + local_138;
    auVar45._4_4_ = (float)uVar9 + fStack_134;
    auVar45._8_4_ = fStack_130 + 0.0;
    auVar45._12_4_ = fStack_12c + 0.0;
    fVar16 = fVar16 + (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z;
    goto LAB_003e1379;
  }
  TVar5 = (sample->pLens).super_Tuple2<pbrt::Point2,_float>;
  fVar17 = TVar5.x;
  fVar21 = TVar5.y;
  auVar25._0_4_ = fVar17 + fVar17;
  auVar25._4_4_ = fVar21 + fVar21;
  auVar25._8_8_ = 0;
  auVar13._8_4_ = 0xbf800000;
  auVar13._0_8_ = 0xbf800000bf800000;
  auVar13._12_4_ = 0xbf800000;
  auVar20 = vaddps_avx512vl(auVar25,auVar13);
  auVar27 = vmovshdup_avx(auVar20);
  fVar21 = auVar20._0_4_;
  fVar17 = auVar27._0_4_;
  if ((fVar21 != 0.0) || (NAN(fVar21))) {
LAB_003e105c:
    auVar14._8_4_ = 0x7fffffff;
    auVar14._0_8_ = 0x7fffffff7fffffff;
    auVar14._12_4_ = 0x7fffffff;
    auVar18 = vandps_avx512vl(auVar20,auVar14);
    auVar27 = vshufps_avx(auVar18,auVar18,0xf5);
    bVar11 = auVar27._0_4_ < auVar18._0_4_;
    auVar41._0_4_ = fVar21 / fVar17;
    auVar41._4_12_ = auVar20._4_12_;
    auVar27 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar41,ZEXT416(0x3fc90fdb));
    local_a8._4_12_ = auVar27._4_12_;
    local_a8._0_4_ =
         (uint)bVar11 * (int)((fVar17 / fVar21) * 0.7853982) + (uint)!bVar11 * auVar27._0_4_;
    fVar17 = (float)((uint)bVar11 * (int)fVar21 + (uint)!bVar11 * (int)fVar17);
    fVar21 = cosf((float)local_a8._0_4_);
    fVar22 = sinf((float)local_a8._0_4_);
    auVar27 = vinsertps_avx(ZEXT416((uint)(fVar17 * fVar21)),ZEXT416((uint)(fVar17 * fVar22)),0x10);
  }
  else {
    auVar27 = ZEXT416(0) << 0x20;
    if ((fVar17 != 0.0) || (NAN(fVar17))) goto LAB_003e105c;
  }
  fVar17 = fVar16 + (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.z;
  local_148._4_4_ = fVar15 * auVar27._4_4_;
  local_148._0_4_ = fVar15 * auVar27._0_4_;
  fStack_140 = fVar15 * auVar27._8_4_;
  fStack_13c = fVar15 * auVar27._12_4_;
  uVar1 = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar7 = (this->dxCamera).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar43._0_4_ = (float)uVar1 + local_138;
  auVar43._4_4_ = (float)uVar7 + fStack_134;
  auVar43._8_4_ = fStack_130 + 0.0;
  auVar43._12_4_ = fStack_12c + 0.0;
  auVar26._0_4_ = auVar43._0_4_ * auVar43._0_4_;
  auVar26._4_4_ = auVar43._4_4_ * auVar43._4_4_;
  auVar26._8_4_ = auVar43._8_4_ * auVar43._8_4_;
  auVar26._12_4_ = auVar43._12_4_ * auVar43._12_4_;
  auVar27 = vmovshdup_avx(auVar26);
  auVar27 = vfmadd231ss_fma(auVar27,auVar43,auVar43);
  auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar17),ZEXT416((uint)fVar17));
  if (auVar27._0_4_ < 0.0) {
    fVar15 = sqrtf(auVar27._0_4_);
  }
  else {
    auVar27 = vsqrtss_avx(auVar27,auVar27);
    fVar15 = auVar27._0_4_;
  }
  auVar33._4_4_ = fVar15;
  auVar33._0_4_ = fVar15;
  auVar33._8_4_ = fVar15;
  auVar33._12_4_ = fVar15;
  auVar27 = vdivps_avx(auVar43,auVar33);
  fVar21 = (this->super_ProjectiveCamera).focalDistance / (fVar17 / fVar15);
  auVar34._0_4_ = auVar27._0_4_ * fVar21 + 0.0;
  auVar34._4_4_ = auVar27._4_4_ * fVar21 + 0.0;
  auVar34._8_4_ = auVar27._8_4_ * fVar21 + 0.0;
  auVar34._12_4_ = auVar27._12_4_ * fVar21 + 0.0;
  fVar15 = (fVar17 / fVar15) * fVar21 + 0.0;
  local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_108.rxOrigin.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(_local_148);
  auVar20 = vsubps_avx(auVar34,_local_148);
  auVar28._0_4_ = auVar20._0_4_ * auVar20._0_4_;
  auVar28._4_4_ = auVar20._4_4_ * auVar20._4_4_;
  auVar28._8_4_ = auVar20._8_4_ * auVar20._8_4_;
  auVar28._12_4_ = auVar20._12_4_ * auVar20._12_4_;
  auVar27 = vmovshdup_avx(auVar28);
  auVar27 = vfmadd231ss_fma(auVar27,auVar20,auVar20);
  auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
  if (auVar27._0_4_ < 0.0) {
    local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = sqrtf(auVar27._0_4_);
  }
  else {
    auVar27 = vsqrtss_avx(auVar27,auVar27);
    local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = auVar27._0_4_;
  }
  auVar36._4_4_ = local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar36._0_4_ = local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar36._8_4_ = local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar36._12_4_ = local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar27 = vdivps_avx(auVar20,auVar36);
  local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z =
       fVar15 / local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  local_108.rxDirection.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar27);
  uVar4 = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar10 = (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar42._0_4_ = (float)uVar4 + local_138;
  auVar42._4_4_ = (float)uVar10 + fStack_134;
  auVar42._8_4_ = fStack_130 + 0.0;
  auVar42._12_4_ = fStack_12c + 0.0;
  fVar16 = fVar16 + (this->dyCamera).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar29._0_4_ = auVar42._0_4_ * auVar42._0_4_;
  auVar29._4_4_ = auVar42._4_4_ * auVar42._4_4_;
  auVar29._8_4_ = auVar42._8_4_ * auVar42._8_4_;
  auVar29._12_4_ = auVar42._12_4_ * auVar42._12_4_;
  auVar27 = vmovshdup_avx(auVar29);
  auVar27 = vfmadd231ss_fma(auVar27,auVar42,auVar42);
  auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar16),ZEXT416((uint)fVar16));
  if (auVar27._0_4_ < 0.0) {
    fVar15 = sqrtf(auVar27._0_4_);
  }
  else {
    auVar27 = vsqrtss_avx(auVar27,auVar27);
    fVar15 = auVar27._0_4_;
  }
  auVar37._4_4_ = fVar15;
  auVar37._0_4_ = fVar15;
  auVar37._8_4_ = fVar15;
  auVar37._12_4_ = fVar15;
  auVar27 = vdivps_avx(auVar42,auVar37);
  fVar17 = (this->super_ProjectiveCamera).focalDistance / (fVar16 / fVar15);
  auVar38._0_4_ = auVar27._0_4_ * fVar17 + 0.0;
  auVar38._4_4_ = auVar27._4_4_ * fVar17 + 0.0;
  auVar38._8_4_ = auVar27._8_4_ * fVar17 + 0.0;
  auVar38._12_4_ = auVar27._12_4_ * fVar17 + 0.0;
  fVar16 = (fVar16 / fVar15) * fVar17 + 0.0;
  uVar6 = vmovlps_avx(_local_148);
  local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar6;
  local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar6 >> 0x20);
  local_108.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  auVar45 = vsubps_avx(auVar38,_local_148);
LAB_003e1379:
  auVar30._0_4_ = auVar45._0_4_ * auVar45._0_4_;
  auVar30._4_4_ = auVar45._4_4_ * auVar45._4_4_;
  auVar30._8_4_ = auVar45._8_4_ * auVar45._8_4_;
  auVar30._12_4_ = auVar45._12_4_ * auVar45._12_4_;
  auVar27 = vmovshdup_avx(auVar30);
  auVar27 = vfmadd231ss_fma(auVar27,auVar45,auVar45);
  auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar16),ZEXT416((uint)fVar16));
  if (auVar27._0_4_ < 0.0) {
    local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z = sqrtf(auVar27._0_4_);
  }
  else {
    auVar27 = vsqrtss_avx(auVar27,auVar27);
    local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z = auVar27._0_4_;
  }
  auVar39._4_4_ = local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar39._0_4_ = local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar39._8_4_ = local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar39._12_4_ = local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar27 = vdivps_avx(auVar45,auVar39);
  local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z =
       fVar16 / local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z;
  local_108.ryDirection.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar27);
  local_108.hasDifferentials = true;
  AnimatedTransform::operator()
            ((RayDifferential *)&local_90,(AnimatedTransform *)this,&local_108,(Float *)0x0);
  __return_storage_ptr__->set = true;
  (__return_storage_ptr__->optionalValue).__align = local_90;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) = CONCAT44(fStack_84,fStack_88);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xc) = CONCAT44(fStack_80,fStack_84);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x14) = uStack_7c;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    *)((long)&__return_storage_ptr__->optionalValue + 0x20))->bits = local_70.bits;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = local_68;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uStack_60;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x38) = CONCAT44(fStack_54,fStack_58);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x40) = CONCAT44(fStack_4c,fStack_50);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x3c) = CONCAT44(fStack_50,fStack_54);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x44) = CONCAT44(fStack_48,fStack_4c);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x4c) = uStack_44;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x54) = uStack_3c;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0x3f8000003f800000;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0x3f8000003f800000;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraRayDifferential> PerspectiveCamera::GenerateRayDifferential(
    const CameraSample &sample, SampledWavelengths &lambda) const {
    // Compute raster and camera sample positions
    Point3f pFilm = Point3f(sample.pFilm.x, sample.pFilm.y, 0);
    Point3f pCamera = cameraFromRaster(pFilm);
    Vector3f dir = Normalize(Vector3f(pCamera.x, pCamera.y, pCamera.z));
    RayDifferential ray(Point3f(0, 0, 0), dir, SampleTime(sample.time), medium);
    // Modify ray for depth of field
    if (lensRadius > 0) {
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        // Compute point on plane of focus
        Float ft = focalDistance / ray.d.z;
        Point3f pFocus = ray(ft);

        // Update ray for effect of lens
        ray.o = Point3f(pLens.x, pLens.y, 0);
        ray.d = Normalize(pFocus - ray.o);
    }

    // Compute offset rays for \use{PerspectiveCamera} ray differentials
    if (lensRadius > 0) {
        // Compute \use{PerspectiveCamera} ray differentials accounting for lens
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        // Compute $x$ ray differential for _PerspectiveCamera_ with lens
        Vector3f dx = Normalize(Vector3f(pCamera + dxCamera));
        Float ft = focalDistance / dx.z;
        Point3f pFocus = Point3f(0, 0, 0) + (ft * dx);
        ray.rxOrigin = Point3f(pLens.x, pLens.y, 0);
        ray.rxDirection = Normalize(pFocus - ray.rxOrigin);

        // Compute $y$ ray differential for _PerspectiveCamera_ with lens
        Vector3f dy = Normalize(Vector3f(pCamera + dyCamera));
        ft = focalDistance / dy.z;
        pFocus = Point3f(0, 0, 0) + (ft * dy);
        ray.ryOrigin = Point3f(pLens.x, pLens.y, 0);
        ray.ryDirection = Normalize(pFocus - ray.ryOrigin);

    } else {
        ray.rxOrigin = ray.ryOrigin = ray.o;
        ray.rxDirection = Normalize(Vector3f(pCamera) + dxCamera);
        ray.ryDirection = Normalize(Vector3f(pCamera) + dyCamera);
    }

    ray.hasDifferentials = true;
    return CameraRayDifferential{RenderFromCamera(ray)};
}